

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O0

int __thiscall avilib::AviReader::open(AviReader *this,char *__file,int __oflag,...)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  long *plVar5;
  streamoff sVar6;
  uint8_t *puVar7;
  char *pcVar8;
  undefined8 uVar9;
  reference p_Var10;
  iterator pvVar11;
  void *pvVar12;
  undefined7 extraout_var;
  long lVar13;
  undefined1 auVar14 [16];
  fpos<__mbstate_t> fVar15;
  uint local_a88 [2];
  FOURCC *local_a80;
  uint local_a78;
  DWORD local_a70;
  uint local_a68;
  DWORD local_a60;
  DWORD local_a58;
  uint local_a50;
  DWORD local_a48;
  DWORD local_a40;
  uint local_a38;
  DWORD local_a30;
  DWORD local_a28;
  DWORD local_a20;
  DWORD local_a18;
  DWORD local_a10;
  int local_a08;
  int local_a00;
  int local_9f8;
  int local_9f0;
  LoggingObject *local_9e0;
  allocator *local_9d8;
  ifstream *local_9d0;
  ifstream *local_9c8;
  streamoff local_9c0;
  mapped_type *local_9b8;
  void *local_9b0;
  mapped_type *local_9a8;
  void *local_9a0;
  LoggingObject *local_998;
  allocator *local_990;
  LoggingObject *local_988;
  allocator *local_980;
  array<unsigned_int,_6UL> *local_978;
  uint *local_970;
  uint *local_968;
  uint local_95c;
  LoggingObject *local_958;
  char *local_950;
  allocator *local_948;
  LoggingObject *local_940;
  allocator *local_938;
  int local_91c;
  fpos<__mbstate_t> *local_918;
  ifstream *local_910;
  WORD *local_908;
  allocator *local_900;
  undefined8 local_8f8;
  ifstream *local_8f0;
  LoggingObject *local_8e8;
  char *local_8e0;
  allocator *local_8d8;
  uint8_t *local_8d0;
  LoggingObject *local_8c8;
  char *local_8c0;
  allocator *local_8b8;
  string *local_8b0;
  int local_8a4;
  mapped_type *local_8a0;
  uint8_t *local_898;
  allocator *local_890;
  deque<unsigned_long,_std::allocator<unsigned_long>_> *local_888;
  LoggingObject *local_880;
  char *local_878;
  allocator *local_870;
  ifstream *local_868;
  BITMAPINFO *local_860;
  LoggingObject *local_858;
  allocator *local_850;
  uint local_844;
  uint local_840;
  uint local_83c;
  ifstream *local_838;
  WAVEFORMATEX *local_830;
  long local_828;
  undefined1 *local_820;
  int local_814;
  int local_810;
  DWORD local_80c;
  LoggingObject *local_808;
  allocator *local_800;
  char local_7f1;
  DWORD local_7f0;
  char local_7e9;
  uint local_7e8;
  char local_7e1;
  int local_7e0;
  char local_7d9;
  uint local_7d8;
  char local_7d1;
  uint local_7d0;
  char local_7c9;
  uint local_7c8;
  char local_7c1;
  uint local_7c0;
  char local_7b9;
  char *local_7b8;
  LoggingObject *local_7b0;
  char *local_7a8;
  allocator *local_7a0;
  LoggingObject *local_798;
  char *local_790;
  allocator *local_788;
  LoggingObject *local_780;
  allocator *local_778;
  AviReader *local_770;
  allocator local_761;
  string local_760 [32];
  void *local_740;
  VIDEO_FIELD_DESC *p_field_desc;
  ulong local_730;
  undefined1 local_724 [8];
  VIDEO_PROP_HEADER vprop_header;
  DMLINDEX dml_index_1;
  AVISTDINDEX_ENTRY *idx_1;
  uint32_t j;
  uint8_t *p0_1;
  uint8_t *p_1;
  string local_6c0 [39];
  allocator local_699;
  string local_698 [32];
  undefined1 auStack_678 [8];
  array<unsigned_int,_6UL> allowed;
  ulong uStack_658;
  AVISTDINDEX std_index;
  AVISUPERINDEX_ENTRY *entry_1;
  iterator __end21;
  iterator __begin21;
  deque<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_> *__range21;
  string local_5d8 [32];
  undefined1 local_5b8 [8];
  AVISUPERINDEX_ENTRY entry;
  undefined1 local_5a0 [4];
  uint32_t i_1;
  deque<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_> entries;
  string local_548 [72];
  string local_500 [32];
  int local_4e0;
  allocator local_4d9;
  int32_t stream_idx_1;
  string fcc_1;
  AVISUPERINDEX super_index;
  fpos<__mbstate_t> local_488;
  undefined1 local_478 [8];
  streampos superindex_end;
  string local_460 [39];
  allocator local_439;
  string local_438 [32];
  string local_418 [32];
  int local_3f8;
  allocator local_3f1;
  int32_t stream_idx;
  string fcc;
  DMLINDEX dml_index;
  AVIOLDINDEX *idx;
  size_t i;
  uint8_t *p0;
  uint8_t *p;
  undefined8 local_390;
  value_type_conflict1 local_388;
  allocator local_379;
  string local_378 [32];
  uint local_358;
  allocator local_351;
  string local_350 [32];
  uint local_330;
  allocator local_329;
  string local_328 [39];
  allocator local_301;
  string local_300 [39];
  allocator local_2d9;
  string local_2d8 [32];
  undefined1 local_2b8 [16];
  streamoff local_2a8;
  int64_t pos;
  allocator local_289;
  string local_288 [32];
  char local_268 [8];
  char message [512];
  int local_5c;
  int32_t i_streamHeader;
  bool b_audio;
  uint32_t size;
  char *pcStack_48;
  char tag [5];
  char *filename_local;
  AviReader *this_local;
  
  local_770 = this;
  pcStack_48 = __file;
  memset(&b_audio,0,5);
  i_streamHeader = 0;
  bVar3 = false;
  local_5c = 0;
  local_770->m_useMovieOffset = false;
  LoggingObject::clear_log(&local_770->super_LoggingObject);
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::clear(&local_770->m_moviOffs);
  std::ifstream::open((char *)&local_770->_f,(_Ios_Openmode)pcStack_48);
  uVar4 = std::ios::good();
  if ((uVar4 & 1) == 0) {
    local_780 = &local_770->super_LoggingObject;
    local_778 = &local_289;
    std::allocator<char>::allocator();
    dVar1 = (double)std::__cxx11::string::string(local_288,"Cannot parse, file is bad.",local_778);
    LoggingObject::log(local_780,dVar1);
    std::__cxx11::string::~string(local_288);
    uVar4 = std::allocator<char>::~allocator((allocator<char> *)&local_289);
    this_local._7_1_ = 0;
  }
  else {
    std::istream::seekg((long)&local_770->_f,_S_beg);
    while( true ) {
      uVar4 = std::ios::good();
      if ((uVar4 & 1) == 0) break;
      auVar14 = std::istream::tellg();
      local_2b8 = auVar14;
      local_2a8 = std::fpos::operator_cast_to_long((fpos *)local_2b8);
      plVar5 = (long *)std::istream::read((char *)&local_770->_f,(long)&b_audio);
      uVar4 = std::ios::operator!((ios *)((long)plVar5 + *(long *)(*plVar5 + -0x18)));
      if ((uVar4 & 1) != 0) break;
      local_790 = local_268;
      snprintf(local_790,0x200,"%s @ %llu",&b_audio,local_2a8);
      local_798 = &local_770->super_LoggingObject;
      local_788 = &local_2d9;
      std::allocator<char>::allocator();
      dVar1 = (double)std::__cxx11::string::string(local_2d8,local_790,local_788);
      LoggingObject::log(local_798,dVar1);
      std::__cxx11::string::~string(local_2d8);
      uVar4 = std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
      if (_b_audio == 0x4b4e554a) {
        std::istream::read((char *)&local_770->_f,(long)&i_streamHeader);
        std::istream::seekg((long)&local_770->_f,i_streamHeader);
      }
      else if (_b_audio == 0x46464952) {
        std::istream::read((char *)&local_770->_f,(long)&i_streamHeader);
      }
      else if ((_b_audio != 0x20495641) && (_b_audio != 0x58495641)) {
        if (_b_audio == 0x5453494c) {
          std::istream::read((char *)&local_770->_f,(long)&i_streamHeader);
        }
        else if (_b_audio != 0x6c726468) {
          if (_b_audio == 0x68697661) {
            std::istream::read((char *)&local_770->_f,(long)&i_streamHeader);
            uVar4 = (ulong)(uint)i_streamHeader;
            if (uVar4 != 0x38) {
              this_local._7_1_ = 0;
              goto LAB_00197d68;
            }
            (local_770->m_avimHeader).fcc._ = _b_audio;
            (local_770->m_avimHeader).cb = i_streamHeader;
            std::istream::read((char *)&local_770->_f,
                               (long)&(local_770->m_avimHeader).dwMicroSecPerFrame);
            local_a88[0] = (local_770->m_avimHeader).dwStreams;
            local_a70 = (local_770->m_avimHeader).dwMicroSecPerFrame;
            local_a78 = (local_770->m_avimHeader).dwMaxBytesPerSec;
            local_a68 = (local_770->m_avimHeader).dwPaddingGranularity;
            local_a60 = (local_770->m_avimHeader).dwSuggestedBufferSize;
            local_a58 = (local_770->m_avimHeader).dwTotalFrames;
            local_a80 = (FOURCC *)
                        CONCAT44(local_a80._4_4_,(local_770->m_avimHeader).dwInitialFrames);
            local_7a8 = local_268;
            snprintf(local_7a8,0x200,
                     "AVIMAINHEADER (\n  dwFlags=0x%x,\n  dwWidth=%i,\n  dwHeight=%i,\n  dwStreams=%i,\n  dwInitialFrames=%i,\n  dwMaxBytesPerSec=%i\n  dwMicroSecPerFrame=%i\n  dwPaddingGranularity=%i\n  dwSuggestedBufferSize=%i\n  dwTotalFrames=%i\n)"
                     ,(ulong)(local_770->m_avimHeader).dwFlags,
                     (ulong)(local_770->m_avimHeader).dwWidth,
                     (ulong)(local_770->m_avimHeader).dwHeight);
            local_7b0 = &local_770->super_LoggingObject;
            local_7a0 = &local_301;
            std::allocator<char>::allocator();
            dVar1 = (double)std::__cxx11::string::string(local_300,local_7a8,local_7a0);
            LoggingObject::log(local_7b0,dVar1);
            std::__cxx11::string::~string(local_300);
            std::allocator<char>::~allocator((allocator<char> *)&local_301);
          }
          else if (_b_audio == 0x6c727473) {
            if (1 < local_5c) {
              this_local._7_1_ = 0;
              goto LAB_00197d68;
            }
            std::istream::read((char *)&local_770->_f,(long)(local_770->m_avisHeader + local_5c));
            bVar3 = local_770->m_avisHeader[local_5c].fccType._ == 0x73647561;
            if (!bVar3) {
              local_770->m_videoStreamIdx = local_5c;
            }
            local_7b8 = local_268;
            if (local_770->m_avisHeader[local_5c].fccType.fcc[0] == '\0') {
              local_7b9 = '?';
            }
            else {
              local_7b9 = local_770->m_avisHeader[local_5c].fccType.fcc[0];
            }
            local_7c0 = (uint)local_7b9;
            if (local_770->m_avisHeader[local_5c].fccType.fcc[1] == '\0') {
              local_7c1 = '?';
            }
            else {
              local_7c1 = local_770->m_avisHeader[local_5c].fccType.fcc[1];
            }
            local_7c8 = (uint)local_7c1;
            if (local_770->m_avisHeader[local_5c].fccType.fcc[2] == '\0') {
              local_7c9 = '?';
            }
            else {
              local_7c9 = local_770->m_avisHeader[local_5c].fccType.fcc[2];
            }
            local_7d0 = (uint)local_7c9;
            if (local_770->m_avisHeader[local_5c].fccType.fcc[3] == '\0') {
              local_7d1 = '?';
            }
            else {
              local_7d1 = local_770->m_avisHeader[local_5c].fccType.fcc[3];
            }
            local_a88[0] = (uint)local_7d1;
            if (local_770->m_avisHeader[local_5c].fccHandler.fcc[0] == '\0') {
              local_7d9 = '?';
            }
            else {
              local_7d9 = local_770->m_avisHeader[local_5c].fccHandler.fcc[0];
            }
            local_7e0 = (int)local_7d9;
            if (local_770->m_avisHeader[local_5c].fccHandler.fcc[1] == '\0') {
              local_7e1 = '?';
            }
            else {
              local_7e1 = local_770->m_avisHeader[local_5c].fccHandler.fcc[1];
            }
            local_a78 = (uint)local_7e1;
            if (local_770->m_avisHeader[local_5c].fccHandler.fcc[2] == '\0') {
              local_7e9 = '?';
            }
            else {
              local_7e9 = local_770->m_avisHeader[local_5c].fccHandler.fcc[2];
            }
            local_a70 = (DWORD)local_7e9;
            if (local_770->m_avisHeader[local_5c].fccHandler.fcc[3] == '\0') {
              local_7f1 = '?';
            }
            else {
              local_7f1 = local_770->m_avisHeader[local_5c].fccHandler.fcc[3];
            }
            local_a68 = (uint)local_7f1;
            lVar13 = (long)local_5c;
            local_828 = lVar13 * 0x40;
            local_a60 = local_770->m_avisHeader[lVar13].dwFlags;
            local_a48 = local_770->m_avisHeader[lVar13].dwInitialFrames;
            local_a40 = local_770->m_avisHeader[lVar13].dwScale;
            local_a38 = local_770->m_avisHeader[lVar13].dwRate;
            local_a30 = local_770->m_avisHeader[lVar13].dwStart;
            local_a28 = local_770->m_avisHeader[lVar13].dwLength;
            local_a20 = local_770->m_avisHeader[lVar13].dwSuggestedBufferSize;
            local_a18 = local_770->m_avisHeader[lVar13].dwQuality;
            local_a10 = local_770->m_avisHeader[lVar13].dwSampleSize;
            local_a08 = (int)local_770->m_avisHeader[lVar13].rcFrame.left;
            local_a00 = (int)local_770->m_avisHeader[lVar13].rcFrame.top;
            local_9f8 = (int)local_770->m_avisHeader[lVar13].rcFrame.right;
            local_9f0 = (int)local_770->m_avisHeader[lVar13].rcFrame.bottom;
            local_a50 = (uint)local_770->m_avisHeader[lVar13].wLanguage;
            local_a58 = (DWORD)local_770->m_avisHeader[lVar13].wPriority;
            local_a80 = (FOURCC *)CONCAT44(local_a80._4_4_,local_7e0);
            local_820 = (undefined1 *)local_a88;
            local_814 = local_9f8;
            local_810 = local_a00;
            local_80c = local_a40;
            local_7f0 = local_a70;
            local_7e8 = local_a78;
            local_7d8 = local_a88[0];
            snprintf(local_7b8,0x200,
                     "AVISTREAMHEADER (\n  fccType=%c%c%c%c,\n  fccHandler=%c%c%c%c,\n  dwFlags=%i,\n  wPriority=%i,\n  wLanguage=%i,\n  dwInitialFrames=%i\n  dwScale=%i\n  dwRate=%i\n  dwStart=%i\n  dwLength=%i\n  dwSuggestedBufferSize=%i\n  dwQuality=%i\n  dwSampleSize=%i\n  rcFrame.left=%i\n  rcFrame.top=%i\n  rcFrame.right=%i\n  rcFrame.bottom=%i\n)"
                     ,(ulong)local_7c0,(ulong)local_7c8,(ulong)local_7d0);
            local_808 = &local_770->super_LoggingObject;
            local_800 = &local_329;
            std::allocator<char>::allocator();
            dVar1 = (double)std::__cxx11::string::string(local_328,local_268,local_800);
            LoggingObject::log(local_808,dVar1);
            std::__cxx11::string::~string(local_328);
            std::allocator<char>::~allocator((allocator<char> *)&local_329);
            local_5c = local_5c + 1;
          }
          else if (_b_audio != 0x68727473) {
            if (_b_audio == 0x66727473) {
              std::istream::read((char *)&local_770->_f,(long)&i_streamHeader);
              if (bVar3) {
                local_838 = &local_770->_f;
                local_830 = &local_770->m_waveformat;
                local_330 = 0x14;
                std::min<unsigned_int>((uint *)&i_streamHeader,&local_330);
                std::istream::read((char *)local_838,(long)local_830);
                if ((local_770->m_waveformat).wFormatTag == 0xfffe) {
                  std::istream::seekg((long)&local_770->_f,0xffffffec);
                  std::istream::read((char *)&local_770->_f,(long)&local_770->m_waveformatExt);
                  std::istream::seekg((long)&local_770->_f,i_streamHeader - 0x2c);
                  local_a88[0] = (local_770->m_waveformat).nSamplesPerSec;
                  local_a68 = (local_770->m_waveformatExt).dwChannelMask;
                  local_a80 = (FOURCC *)
                              CONCAT44(local_a80._4_4_,
                                       (uint)(local_770->m_waveformat).wBitsPerSample);
                  local_a78 = (uint)(local_770->m_waveformat).nBlockAlign;
                  local_a70 = (DWORD)(local_770->m_waveformatExt).Samples.wValidBitsPerSample;
                  snprintf(local_268,0x200,
                           "WAVEFORMATEXTENSIBLE (\n  wFormatTag=0x%04x,\n  nChannels=%i,\n  nAvgBytesPerSec=%i,\n  nSamplesPerSec=%i,\n  wBitsPerSample=%i,\n  nBlockAlign=%i,\n  SubFormat=...,\n  wSamplesPerBlock=%i,\n  dwChannelMask=%i\n)"
                           ,(ulong)(local_770->m_waveformat).wFormatTag,
                           (ulong)(local_770->m_waveformat).nChannels,
                           (ulong)(local_770->m_waveformat).nAvgBytesPerSec);
                }
                else if ((local_770->m_waveformat).wFormatTag == 0x50) {
                  std::istream::seekg((long)&local_770->_f,0xffffffec);
                  std::istream::read((char *)&local_770->_f,(long)&local_770->m_waveformatMpeg12);
                  std::istream::seekg((long)&local_770->_f,i_streamHeader - 0x2c);
                  local_a88[0] = (local_770->m_waveformat).nSamplesPerSec;
                  local_844 = (uint)(local_770->m_waveformat).wBitsPerSample;
                  local_a78 = (uint)(local_770->m_waveformat).nBlockAlign;
                  local_a70 = (local_770->m_waveformatMpeg12).dwHeadBitrate;
                  local_a68 = (local_770->m_waveformatMpeg12).dwPTSHigh;
                  local_a60 = (local_770->m_waveformatMpeg12).dwPTSLow;
                  local_a38 = (uint)(local_770->m_waveformatMpeg12).wHeadEmphasis;
                  local_a80 = (FOURCC *)CONCAT44(local_a80._4_4_,local_844);
                  local_a58 = (DWORD)(local_770->m_waveformatMpeg12).fwHeadFlags;
                  local_a50 = (uint)(local_770->m_waveformatMpeg12).fwHeadLayer;
                  local_a48 = (DWORD)(local_770->m_waveformatMpeg12).fwHeadMode;
                  local_a40 = (DWORD)(local_770->m_waveformatMpeg12).fwHeadModeExt;
                  local_840 = local_a78;
                  local_83c = local_a38;
                  snprintf(local_268,0x200,
                           "MPEG1WAVEFORMAT (\n  wFormatTag=0x%04x,\n  nChannels=%i,\n  nAvgBytesPerSec=%i,\n  nSamplesPerSec=%i,\n  wBitsPerSample=%i,\n  nBlockAlign=%i,\n  dwHeadBitrate=%i,\n  dwPTSHigh=%i,\n  dwPTSLow=%i,\n  fwHeadFlags=%i,\n  fwHeadLayer=%i,\n  fwHeadMode=%i,\n  fwHeadModeExt=%i,\n  wHeadEmphasis%i\n)"
                           ,(ulong)(local_770->m_waveformat).wFormatTag,
                           (ulong)(local_770->m_waveformat).nChannels,
                           (ulong)(local_770->m_waveformat).nAvgBytesPerSec);
                }
                else if ((local_770->m_waveformat).wFormatTag == 0x55) {
                  std::istream::seekg((long)&local_770->_f,0xffffffec);
                  std::istream::read((char *)&local_770->_f,(long)&local_770->m_waveformatMP3);
                  std::istream::seekg((long)&local_770->_f,i_streamHeader - 0x24);
                  local_a88[0] = (local_770->m_waveformat).nSamplesPerSec;
                  local_a70 = (local_770->m_waveformatMP3).fdwFlags;
                  local_a80 = (FOURCC *)
                              CONCAT44(local_a80._4_4_,
                                       (uint)(local_770->m_waveformat).wBitsPerSample);
                  local_a78 = (uint)(local_770->m_waveformat).nBlockAlign;
                  local_a68 = (uint)(local_770->m_waveformatMP3).nBlockSize;
                  local_a60 = (DWORD)(local_770->m_waveformatMP3).nCodecDelay;
                  local_a58 = (DWORD)(local_770->m_waveformatMP3).nFramesPerBlock;
                  local_a50 = (uint)(local_770->m_waveformatMP3).wID;
                  snprintf(local_268,0x200,
                           "MPEGLAYER3WAVEFORMAT (\n  wFormatTag=0x%04x,\n  nChannels=%i,\n  nAvgBytesPerSec=%i,\n  nSamplesPerSec=%i,\n  wBitsPerSample=%i,\n  nBlockAlign=%i\n  fdwFlags%i,\n  nBlockSize%i,\n  nCodecDelay%i,\n  nFramesPerBlock%i,\n  wID=%i\n)"
                           ,(ulong)(local_770->m_waveformat).wFormatTag,
                           (ulong)(local_770->m_waveformat).nChannels,
                           (ulong)(local_770->m_waveformat).nAvgBytesPerSec);
                }
                else {
                  std::istream::seekg((long)&local_770->_f,i_streamHeader - 0x14);
                  local_a88[0] = (local_770->m_waveformat).nSamplesPerSec;
                  local_a80 = (FOURCC *)
                              CONCAT44(local_a80._4_4_,
                                       (uint)(local_770->m_waveformat).wBitsPerSample);
                  local_a78 = (uint)(local_770->m_waveformat).nBlockAlign;
                  snprintf(local_268,0x200,
                           "WAVEFORMATEX (\n  wFormatTag=0x%04x,\n  nChannels=%i,\n  nAvgBytesPerSec=%i,\n  nSamplesPerSec=%i,\n  wBitsPerSample=%i,\n  nBlockAlign=%i\n)"
                           ,(ulong)(local_770->m_waveformat).wFormatTag,
                           (ulong)(local_770->m_waveformat).nChannels,
                           (ulong)(local_770->m_waveformat).nAvgBytesPerSec);
                }
                local_858 = &local_770->super_LoggingObject;
                local_850 = &local_351;
                std::allocator<char>::allocator();
                dVar1 = (double)std::__cxx11::string::string(local_350,local_268,local_850);
                LoggingObject::log(local_858,dVar1);
                std::__cxx11::string::~string(local_350);
                std::allocator<char>::~allocator((allocator<char> *)&local_351);
              }
              else {
                local_868 = &local_770->_f;
                local_860 = &local_770->m_bitmapInfo;
                local_358 = 0x28;
                std::min<unsigned_int>((uint *)&i_streamHeader,&local_358);
                std::istream::read((char *)local_868,(long)local_860);
                if (0x28 < (uint)i_streamHeader) {
                  std::istream::seekg((long)&local_770->_f,i_streamHeader - 0x28);
                }
                local_a80 = &(local_770->m_bitmapInfo).biCompression;
                local_a78 = (local_770->m_bitmapInfo).biSizeImage;
                local_a70 = (local_770->m_bitmapInfo).biXPelsPerMeter;
                local_a68 = (local_770->m_bitmapInfo).biYPelsPerMeter;
                local_a60 = (local_770->m_bitmapInfo).biClrUsed;
                local_a58 = (local_770->m_bitmapInfo).biClrImportant;
                local_a88[0] = (uint)(local_770->m_bitmapInfo).biBitCount;
                local_878 = local_268;
                snprintf(local_878,0x200,
                         "BITMAPINFO (\n  biWidth=%i,\n  biHeight=%i,\n  biPlanes=%i,\n  biBitCount=%i,\n  biCompression=%s,\n  biSizeImage=%i,\n  biXPelsPerMeter=%i,\n  biYPelsPerMeter=%i,\n  biClrUsed=%i,\n  biClrImportant=%i,\n)"
                         ,(ulong)(uint)(local_770->m_bitmapInfo).biWidth,
                         (ulong)(uint)(local_770->m_bitmapInfo).biHeight,
                         (ulong)(local_770->m_bitmapInfo).biPlanes);
                local_880 = &local_770->super_LoggingObject;
                local_870 = &local_379;
                std::allocator<char>::allocator();
                dVar1 = (double)std::__cxx11::string::string(local_378,local_878,local_870);
                LoggingObject::log(local_880,dVar1);
                std::__cxx11::string::~string(local_378);
                std::allocator<char>::~allocator((allocator<char> *)&local_379);
              }
            }
            else if (_b_audio != 0x4f464e49) {
              if (_b_audio == 0x54465349) {
                std::istream::read((char *)&local_770->_f,(long)&i_streamHeader);
                std::istream::seekg((long)&local_770->_f,i_streamHeader);
              }
              else if (_b_audio == 0x6e727473) {
                std::istream::read((char *)&local_770->_f,(long)&i_streamHeader);
                std::istream::seekg((long)&local_770->_f,i_streamHeader - 4);
              }
              else if (_b_audio == 0x69766f6d) {
                local_888 = &local_770->m_moviOffs;
                auVar14 = std::istream::tellg();
                local_390 = auVar14._8_8_;
                p = auVar14._0_8_;
                sVar6 = std::fpos::operator_cast_to_long((fpos *)&p);
                local_388 = sVar6 - 4;
                std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                          (local_888,&local_388);
                std::istream::seekg((long)&local_770->_f,i_streamHeader - 4);
              }
              else if (_b_audio == 0x31786469) {
                std::istream::read((char *)&local_770->_f,(long)&i_streamHeader);
                puVar7 = (uint8_t *)operator_new__((ulong)(uint)i_streamHeader);
                std::istream::read((char *)&local_770->_f,(long)puVar7);
                i_streamHeader = std::istream::gcount();
                p0 = puVar7;
                for (idx = (AVIOLDINDEX *)0x0;
                    idx < (AVIOLDINDEX *)(ulong)((uint)i_streamHeader >> 4);
                    idx = (AVIOLDINDEX *)((long)&idx->dwChunkId + 1)) {
                  if (*(int *)p0 != 0x20636572) {
                    fcc.field_2._8_4_ = *(undefined4 *)p0;
                    fcc.field_2._12_4_ = *(undefined4 *)(p0 + 4);
                    local_898 = p0;
                    local_890 = &local_3f1;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string((string *)&stream_idx,(char *)local_898,local_890);
                    std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
                    std::__cxx11::string::substr((ulong)local_418,(ulong)&stream_idx);
                    local_8b0 = local_418;
                    pcVar8 = (char *)std::__cxx11::string::c_str();
                    local_8a4 = atoi(pcVar8);
                    std::__cxx11::string::~string(local_8b0);
                    local_3f8 = local_8a4;
                    local_8a0 = std::
                                map<int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>_>_>_>
                                ::operator[](&local_770->m_frameIdxs,&local_3f8);
                    std::
                    deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>
                    ::push_back(local_8a0,(value_type *)((long)&fcc.field_2 + 8));
                    std::__cxx11::string::~string((string *)&stream_idx);
                  }
                  p0 = p0 + 0x10;
                }
                local_8c0 = local_268;
                snprintf(local_8c0,0x200,"%x AVIOLDINDEX",(ulong)((uint)i_streamHeader >> 4));
                local_8c8 = &local_770->super_LoggingObject;
                local_8b8 = &local_439;
                std::allocator<char>::allocator();
                dVar1 = (double)std::__cxx11::string::string(local_438,local_8c0,local_8b8);
                LoggingObject::log(local_8c8,dVar1);
                std::__cxx11::string::~string(local_438);
                std::allocator<char>::~allocator((allocator<char> *)&local_439);
                local_8d0 = puVar7;
                if (puVar7 != (uint8_t *)0x0) {
                  operator_delete__(puVar7);
                }
              }
              else if (_b_audio != 0x6c6d646f) {
                if (_b_audio == 0x686c6d64) {
                  local_8f0 = &local_770->_f;
                  local_8f8 = 4;
                  std::istream::read((char *)local_8f0,(long)&i_streamHeader);
                  std::istream::read((char *)local_8f0,(long)&local_770->m_odmlExt);
                  std::istream::seekg((long)local_8f0,i_streamHeader - 4);
                  local_8e0 = local_268;
                  snprintf(local_8e0,0x200,"ODMLExtendedAVIHeader ( dwTotalFrames=%i )",
                           (ulong)(local_770->m_odmlExt).dwTotalFrames);
                  local_8e8 = &local_770->super_LoggingObject;
                  local_8d8 = (allocator *)(superindex_end._M_state.__value.__wchb + 3);
                  std::allocator<char>::allocator();
                  dVar1 = (double)std::__cxx11::string::string(local_460,local_8e0,local_8d8);
                  LoggingObject::log(local_8e8,dVar1);
                  std::__cxx11::string::~string(local_460);
                  std::allocator<char>::~allocator
                            ((allocator<char> *)(superindex_end._M_state.__value.__wchb + 3));
                }
                else if (_b_audio == 0x6c686d64) {
                  std::istream::read((char *)&local_770->_f,(long)&i_streamHeader);
                  std::istream::seekg((long)&local_770->_f,i_streamHeader);
                }
                else if (_b_audio == 0x78646e69) {
                  local_910 = &local_770->_f;
                  std::istream::read((char *)local_910,(long)&i_streamHeader);
                  fVar15 = (fpos<__mbstate_t>)std::istream::tellg();
                  local_918 = (fpos<__mbstate_t> *)(super_index.dwReserved + 1);
                  local_488 = fVar15;
                  std::fpos<__mbstate_t>::fpos(local_918,(ulong)(uint)i_streamHeader);
                  sVar6 = std::fpos::operator_cast_to_long((fpos *)local_918);
                  _local_478 = std::fpos<__mbstate_t>::operator+(&local_488,sVar6);
                  fcc_1.field_2._8_4_ = _b_audio;
                  fcc_1.field_2._12_4_ = i_streamHeader;
                  std::istream::read((char *)local_910,(long)&super_index);
                  local_908 = &super_index.wLongsPerEntry;
                  local_900 = &local_4d9;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&stream_idx_1,(char *)local_908,local_900);
                  std::allocator<char>::~allocator((allocator<char> *)&local_4d9);
                  std::__cxx11::string::substr((ulong)local_500,(ulong)&stream_idx_1);
                  pcVar8 = (char *)std::__cxx11::string::c_str();
                  local_91c = atoi(pcVar8);
                  std::__cxx11::string::~string(local_500);
                  local_4e0 = local_91c;
                  if (super_index.fcc.fcc[2] != '\0') {
                    __assert_fail("0 == super_index.bIndexSubType",
                                  "/workspace/llm4binary/github/license_c_cmakelists/arionik[P]avilib/reader.cpp"
                                  ,0x10a,"bool avilib::AviReader::open(const char *)");
                  }
                  if (super_index.fcc.fcc[3] != '\0') {
                    local_940 = &local_770->super_LoggingObject;
                    local_938 = (allocator *)
                                ((long)&entries.
                                        super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                        ._M_impl.super__Deque_impl_data._M_finish._M_node + 7);
                    std::allocator<char>::allocator();
                    dVar1 = (double)std::__cxx11::string::string
                                              (local_548,
                                               "Warning: AVI_INDEX_OF_INDEXES != super_index.bIndexType"
                                               ,local_938);
                    LoggingObject::log(local_940,dVar1);
                    std::__cxx11::string::~string(local_548);
                    std::allocator<char>::~allocator
                              ((allocator<char> *)
                               ((long)&entries.
                                       super__Deque_base<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                       ._M_impl.super__Deque_impl_data._M_finish._M_node + 7));
                  }
                  std::
                  deque<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                  ::deque((deque<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                           *)local_5a0);
                  for (entry.dwDuration = 0; entry.dwDuration < super_index.cb;
                      entry.dwDuration = entry.dwDuration + 1) {
                    std::istream::read((char *)&local_770->_f,(long)local_5b8);
                    std::
                    deque<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                    ::push_back((deque<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                                 *)local_5a0,(value_type *)local_5b8);
                  }
                  local_95c = super_index.cb;
                  uVar9 = std::__cxx11::string::c_str();
                  local_950 = local_268;
                  snprintf(local_950,0x200,"%ux AVISUPERINDEX_ENTRY (%s)",(ulong)local_95c,uVar9);
                  local_958 = &local_770->super_LoggingObject;
                  local_948 = (allocator *)((long)&__range21 + 7);
                  std::allocator<char>::allocator();
                  dVar1 = (double)std::__cxx11::string::string(local_5d8,local_950,local_948);
                  LoggingObject::log(local_958,dVar1);
                  std::__cxx11::string::~string(local_5d8);
                  std::allocator<char>::~allocator((allocator<char> *)((long)&__range21 + 7));
                  std::
                  deque<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                  ::begin((iterator *)&__end21._M_node,
                          (deque<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                           *)local_5a0);
                  std::
                  deque<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                  ::end((iterator *)&entry_1,
                        (deque<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                         *)local_5a0);
                  while( true ) {
                    bVar2 = std::operator!=((_Self *)&__end21._M_node,(_Self *)&entry_1);
                    if (!bVar2) break;
                    p_Var10 = std::
                              _Deque_iterator<avilib::_avisuperindex_entry,_avilib::_avisuperindex_entry_&,_avilib::_avisuperindex_entry_*>
                              ::operator*((_Deque_iterator<avilib::_avisuperindex_entry,_avilib::_avisuperindex_entry_&,_avilib::_avisuperindex_entry_*>
                                           *)&__end21._M_node);
                    std::istream::seekg((long)&local_770->_f,(_Ios_Seekdir)p_Var10->qwOffset);
                    std_index.wLongsPerEntry = 0;
                    std_index.bIndexSubType = '\0';
                    std_index.bIndexType = '\0';
                    std_index.nEntriesInUse = 0;
                    std_index.dwChunkId._ = 0;
                    std_index.qwBaseOffset._0_4_ = 0;
                    uStack_658 = 0;
                    std_index.fcc = (FOURCC)0x0;
                    std_index.cb = 0;
                    std::istream::read((char *)&local_770->_f,(long)&uStack_658);
                    if (std_index._8_4_ != 0x20636572) {
                      auStack_678._0_4_ = 0x63643030;
                      auStack_678._4_4_ = 0x62643030;
                      allowed._M_elems[0] = 0x63643130;
                      allowed._M_elems[1] = 0x62643130;
                      allowed._M_elems[2] = 0x62773030;
                      allowed._M_elems[3] = 0x62773130;
                      local_978 = (array<unsigned_int,_6UL> *)auStack_678;
                      local_970 = std::array<unsigned_int,_6UL>::begin(local_978);
                      pvVar11 = std::array<unsigned_int,_6UL>::end(local_978);
                      local_968 = std::find<unsigned_int*,unsigned_int>
                                            (local_970,pvVar11,(uint *)&std_index.wLongsPerEntry);
                      pvVar11 = std::array<unsigned_int,_6UL>::end
                                          ((array<unsigned_int,_6UL> *)auStack_678);
                      if (local_968 != pvVar11) {
                        if (std_index.fcc.fcc[3] != '\x01') {
                          local_988 = &local_770->super_LoggingObject;
                          local_980 = &local_699;
                          std::allocator<char>::allocator();
                          dVar1 = (double)std::__cxx11::string::string
                                                    (local_698,
                                                                                                          
                                                  "Warning: AVI_INDEX_OF_CHUNKS != std_index.bIndexType"
                                                  ,local_980);
                          LoggingObject::log(local_988,dVar1);
                          std::__cxx11::string::~string(local_698);
                          std::allocator<char>::~allocator((allocator<char> *)&local_699);
                        }
                        if (std_index.fcc.fcc[2] != '\0') {
                          local_998 = &local_770->super_LoggingObject;
                          local_990 = (allocator *)((long)&p_1 + 7);
                          std::allocator<char>::allocator();
                          dVar1 = (double)std::__cxx11::string::string
                                                    (local_6c0,
                                                     "Warning: 0 != std_index.bIndexSubType",
                                                     local_990);
                          LoggingObject::log(local_998,dVar1);
                          std::__cxx11::string::~string(local_6c0);
                          std::allocator<char>::~allocator((allocator<char> *)((long)&p_1 + 7));
                        }
                        pvVar12 = operator_new__(uStack_658 >> 0x20);
                        local_9a0 = pvVar12;
                        std::istream::read((char *)&local_770->_f,(long)pvVar12);
                        for (idx_1._4_4_ = 0; idx_1._4_4_ < std_index.cb;
                            idx_1._4_4_ = idx_1._4_4_ + 1) {
                          vprop_header.dwFrameHeightInLines._0_2_ = std_index.wLongsPerEntry;
                          vprop_header.dwFrameHeightInLines._2_1_ = std_index.bIndexSubType;
                          vprop_header.dwFrameHeightInLines._3_1_ = std_index.bIndexType;
                          vprop_header.nbFieldPerFrame = 0;
                          local_9a8 = std::
                                      map<int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>_>_>_>
                                      ::operator[](&local_770->odml_frameIdxs,&local_4e0);
                          std::
                          deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>
                          ::push_back(local_9a8,(value_type *)&vprop_header.dwFrameHeightInLines);
                        }
                        local_9b0 = pvVar12;
                        if (pvVar12 != (void *)0x0) {
                          operator_delete__(pvVar12);
                        }
                      }
                      std::ios::clear(&local_770->_f + *(long *)(*(long *)&local_770->_f + -0x18),0)
                      ;
                    }
                    std::
                    _Deque_iterator<avilib::_avisuperindex_entry,_avilib::_avisuperindex_entry_&,_avilib::_avisuperindex_entry_*>
                    ::operator++((_Deque_iterator<avilib::_avisuperindex_entry,_avilib::_avisuperindex_entry_&,_avilib::_avisuperindex_entry_*>
                                  *)&__end21._M_node);
                  }
                  local_9b8 = std::
                              map<int,_avilib::_avisuperindex_chunk,_std::less<int>,_std::allocator<std::pair<const_int,_avilib::_avisuperindex_chunk>_>_>
                              ::operator[](&local_770->m_superIndex,&local_4e0);
                  local_9b8->dwChunkId = (FOURCC)super_index._8_4_;
                  local_9b8->dwReserved[0] = super_index.nEntriesInUse;
                  *(FOURCC *)(local_9b8->dwReserved + 1) = super_index.dwChunkId;
                  local_9b8->dwReserved[2] = super_index.dwReserved[0];
                  local_9b8->fcc = (FOURCC)fcc_1.field_2._8_4_;
                  local_9b8->cb = fcc_1.field_2._12_4_;
                  *(FOURCC *)&local_9b8->wLongsPerEntry = super_index.fcc;
                  local_9b8->nEntriesInUse = super_index.cb;
                  std::ios::clear(&local_770->_f + *(long *)(*(long *)&local_770->_f + -0x18),0);
                  local_9c8 = &local_770->_f;
                  local_9c0 = std::fpos::operator_cast_to_long((fpos *)local_478);
                  std::istream::seekg((long)local_9c8,(_Ios_Seekdir)local_9c0);
                  std::
                  deque<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                  ::~deque((deque<avilib::_avisuperindex_entry,_std::allocator<avilib::_avisuperindex_entry>_>
                            *)local_5a0);
                  std::__cxx11::string::~string((string *)&stream_idx_1);
                }
                else if (_b_audio == 0x70727076) {
                  std::istream::read((char *)&local_770->_f,(long)&i_streamHeader);
                  local_9d0 = &local_770->_f;
                  local_730 = (ulong)(uint)i_streamHeader;
                  p_field_desc = (VIDEO_FIELD_DESC *)0x24;
                  std::min<unsigned_long>(&local_730,(unsigned_long *)&p_field_desc);
                  std::istream::read((char *)local_9d0,(long)local_724);
                  local_740 = malloc((ulong)vprop_header.dwFrameWidthInPixels << 5);
                  std::istream::read((char *)&local_770->_f,(long)local_740);
                  free(local_740);
                }
                else if (_b_audio != 0x74616454) {
                  std::istream::read((char *)&local_770->_f,(long)&i_streamHeader);
                  std::istream::seekg((long)&local_770->_f,i_streamHeader);
                }
              }
            }
          }
        }
      }
    }
    bVar3 = std::
            map<int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>_>_>_>
            ::empty(&local_770->odml_frameIdxs);
    if (!bVar3) {
      std::
      map<int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<avilib::AviReader::_dmlindex,_std::allocator<avilib::AviReader::_dmlindex>_>_>_>_>
      ::swap(&local_770->m_frameIdxs,&local_770->odml_frameIdxs);
      local_9e0 = &local_770->super_LoggingObject;
      local_9d8 = &local_761;
      std::allocator<char>::allocator();
      dVar1 = (double)std::__cxx11::string::string(local_760,"using OpenDML index",local_9d8);
      LoggingObject::log(local_9e0,dVar1);
      std::__cxx11::string::~string(local_760);
      std::allocator<char>::~allocator((allocator<char> *)&local_761);
    }
    std::ios::clear(&local_770->_f + *(long *)(*(long *)&local_770->_f + -0x18),0);
    std::istream::seekg((long)&local_770->_f,_S_beg);
    bVar3 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::empty(&local_770->m_moviOffs)
    ;
    uVar4 = CONCAT71(extraout_var,bVar3);
    if (bVar3) {
      this_local._7_1_ = 0;
    }
    else {
      this_local._7_1_ = 1;
    }
  }
LAB_00197d68:
  return (int)CONCAT71((int7)(uVar4 >> 8),this_local._7_1_);
}

Assistant:

bool avilib::AviReader::open( const char *filename )
{
	char tag[ 5 ] = {0};
	uint32_t size = 0;
	bool b_audio = false;
	int32_t i_streamHeader = 0;
	m_useMovieOffset = false;
	char message[512];
	clear_log();

	m_moviOffs.clear();
	_f.open( filename, ifstream::binary );
	if( !_f.good() ){
		log( "Cannot parse, file is bad." );
		return false;
	}

	_f.seekg(0,ifstream::beg);
	for(;_f.good();)
	{
		int64_t pos = _f.tellg();
		if( !_f.read( tag, 4 ) ) break;

		snprintf( message, 512, "%s @ " LLU, tag, (uint64_t)pos );
		log( message );

		if( *(uint32_t *)tag == (uint32_t)'KNUJ' ){
			_f.read( (char *)&size, 4 );
			_f.seekg(size,ifstream::cur);
		}
		else if( *(uint32_t *)tag == (uint32_t)'FFIR' ){
			_f.read( (char *)&size, 4 );  // file size
		}
		else if( *(uint32_t *)tag == (uint32_t)' IVA' ){
			continue;
		}
		else if( *(uint32_t *)tag == (uint32_t)'XIVA' ){
			continue; // OPENDML: AVIX, further RIFF chunk(s)
		}
		else if( *(uint32_t *)tag == (uint32_t)'TSIL' ){
			_f.read( (char *)&size, 4 );  // 1st: file size
		}
		else if( *(uint32_t *)tag == (uint32_t)'lrdh' ){
			continue;
		}
		else if( *(uint32_t *)tag == (uint32_t)'hiva' ){
			_f.read( (char *)&size, 4 );  // AVIMAINHEADER
			if( size != sizeof( avilib::AVIMAINHEADER ) - 8 )
				return false;
			m_avimHeader.fcc = *(FOURCC*)tag;
			m_avimHeader.cb = size;
			_f.read( (char *)&m_avimHeader + 8, m_avimHeader.cb );
			snprintf( message, 512, "AVIMAINHEADER (\n  dwFlags=0x%x,\n  dwWidth=%i,\n  dwHeight=%i,\n  dwStreams=%i,\n  dwInitialFrames=%i,\n  dwMaxBytesPerSec=%i\n  dwMicroSecPerFrame=%i\n  dwPaddingGranularity=%i\n  dwSuggestedBufferSize=%i\n  dwTotalFrames=%i\n)",
					m_avimHeader.dwFlags, m_avimHeader.dwWidth, m_avimHeader.dwHeight, m_avimHeader.dwStreams, m_avimHeader.dwInitialFrames, m_avimHeader.dwMaxBytesPerSec, m_avimHeader.dwMicroSecPerFrame, m_avimHeader.dwPaddingGranularity, m_avimHeader.dwSuggestedBufferSize, m_avimHeader.dwTotalFrames );
			log( message );
		}
		else if( *(uint32_t *)tag == (uint32_t)'lrts' ){
			if( i_streamHeader >= 2 ) return false;
			_f.read( (char *)&m_avisHeader[i_streamHeader], sizeof(avilib::AVISTREAMHEADER) );
			b_audio = m_avisHeader[i_streamHeader].fccType._ == (uint32_t)'sdua';
			if( !b_audio )
				m_videoStreamIdx = i_streamHeader;

			snprintf( message, 512, "AVISTREAMHEADER (\n  fccType=%c%c%c%c,\n  fccHandler=%c%c%c%c,\n  dwFlags=%i,\n  wPriority=%i,\n  wLanguage=%i,\n  dwInitialFrames=%i\n  dwScale=%i\n  dwRate=%i\n  dwStart=%i\n  dwLength=%i\n  dwSuggestedBufferSize=%i\n  dwQuality=%i\n  dwSampleSize=%i\n  rcFrame.left=%i\n  rcFrame.top=%i\n  rcFrame.right=%i\n  rcFrame.bottom=%i\n)",
					m_avisHeader[i_streamHeader].fccType.fcc[0] ? m_avisHeader[i_streamHeader].fccType.fcc[0] : '?',
					m_avisHeader[i_streamHeader].fccType.fcc[1] ? m_avisHeader[i_streamHeader].fccType.fcc[1] : '?',
					m_avisHeader[i_streamHeader].fccType.fcc[2] ? m_avisHeader[i_streamHeader].fccType.fcc[2] : '?',
					m_avisHeader[i_streamHeader].fccType.fcc[3] ? m_avisHeader[i_streamHeader].fccType.fcc[3] : '?',
					m_avisHeader[i_streamHeader].fccHandler.fcc[0] ? m_avisHeader[i_streamHeader].fccHandler.fcc[0] : '?',
					m_avisHeader[i_streamHeader].fccHandler.fcc[1] ? m_avisHeader[i_streamHeader].fccHandler.fcc[1] : '?',
					m_avisHeader[i_streamHeader].fccHandler.fcc[2] ? m_avisHeader[i_streamHeader].fccHandler.fcc[2] : '?',
					m_avisHeader[i_streamHeader].fccHandler.fcc[3] ? m_avisHeader[i_streamHeader].fccHandler.fcc[3] : '?',
					m_avisHeader[i_streamHeader].dwFlags,
					m_avisHeader[i_streamHeader].wPriority,
					m_avisHeader[i_streamHeader].wLanguage,
					m_avisHeader[i_streamHeader].dwInitialFrames,
					m_avisHeader[i_streamHeader].dwScale,
					m_avisHeader[i_streamHeader].dwRate,
					m_avisHeader[i_streamHeader].dwStart,
					m_avisHeader[i_streamHeader].dwLength,
					m_avisHeader[i_streamHeader].dwSuggestedBufferSize,
					m_avisHeader[i_streamHeader].dwQuality,
					m_avisHeader[i_streamHeader].dwSampleSize,
					m_avisHeader[i_streamHeader].rcFrame.left,
					m_avisHeader[i_streamHeader].rcFrame.top,
					m_avisHeader[i_streamHeader].rcFrame.right,
					m_avisHeader[i_streamHeader].rcFrame.bottom
					);
			log( message );
			i_streamHeader++;
		}
		else if( *(uint32_t *)tag == (uint32_t)'hrts' ){
			// int z=0;
		}
		else if( *(uint32_t *)tag == (uint32_t)'frts' ){
			_f.read( (char *)&size, 4 );
			if( b_audio ){
				_f.read( (char *)&m_waveformat, std::min( size, (uint32_t)sizeof(avilib::WAVEFORMATEX) ) );
				if( m_waveformat.wFormatTag == WAVE_FORMAT_EXTENSIBLE ){
					_f.seekg(-(std::streamoff)sizeof(avilib::WAVEFORMATEX),ifstream::cur);
					_f.read( (char *)&m_waveformatExt, (uint32_t)sizeof(avilib::WAVEFORMATEXTENSIBLE) );
					_f.seekg(size-sizeof(avilib::WAVEFORMATEXTENSIBLE),ifstream::cur);
					snprintf( message, 512, "WAVEFORMATEXTENSIBLE (\n  wFormatTag=0x%04x,\n  nChannels=%i,\n  nAvgBytesPerSec=%i,\n  nSamplesPerSec=%i,\n  wBitsPerSample=%i,\n  nBlockAlign=%i,\n  SubFormat=...,\n  wSamplesPerBlock=%i,\n  dwChannelMask=%i\n)",
							m_waveformat.wFormatTag, m_waveformat.nChannels, m_waveformat.nAvgBytesPerSec,
							m_waveformat.nSamplesPerSec, m_waveformat.wBitsPerSample, m_waveformat.nBlockAlign,
							m_waveformatExt.Samples.wSamplesPerBlock, m_waveformatExt.dwChannelMask);
				} else if( m_waveformat.wFormatTag == WAVE_FORMAT_MPEG ){
					_f.seekg(-(std::streamoff)sizeof(avilib::WAVEFORMATEX),ifstream::cur);
					_f.read( (char *)&m_waveformatMpeg12, (uint32_t)sizeof(avilib::MPEG1WAVEFORMAT) );
					_f.seekg((std::streamoff)size-sizeof(avilib::MPEG1WAVEFORMAT),ifstream::cur);
					snprintf( message, 512, "MPEG1WAVEFORMAT (\n  wFormatTag=0x%04x,\n  nChannels=%i,\n  nAvgBytesPerSec=%i,\n  nSamplesPerSec=%i,\n  wBitsPerSample=%i,\n  nBlockAlign=%i,\n  dwHeadBitrate=%i,\n  dwPTSHigh=%i,\n  dwPTSLow=%i,\n  fwHeadFlags=%i,\n  fwHeadLayer=%i,\n  fwHeadMode=%i,\n  fwHeadModeExt=%i,\n  wHeadEmphasis%i\n)",
							m_waveformat.wFormatTag, m_waveformat.nChannels, m_waveformat.nAvgBytesPerSec,
							m_waveformat.nSamplesPerSec, m_waveformat.wBitsPerSample, m_waveformat.nBlockAlign,
							m_waveformatMpeg12.dwHeadBitrate, m_waveformatMpeg12.dwPTSHigh, m_waveformatMpeg12.dwPTSLow,
							m_waveformatMpeg12.fwHeadFlags, m_waveformatMpeg12.fwHeadLayer, m_waveformatMpeg12.fwHeadMode,
							m_waveformatMpeg12.fwHeadModeExt, m_waveformatMpeg12.wHeadEmphasis );
				} else if( m_waveformat.wFormatTag == WAVE_FORMAT_MPEGLAYER3 ){
					_f.seekg(-(std::streamoff)sizeof(avilib::WAVEFORMATEX),ifstream::cur);
					_f.read( (char *)&m_waveformatMP3, (uint32_t)sizeof(avilib::MPEGLAYER3WAVEFORMAT) );
					_f.seekg(size-sizeof(avilib::MPEGLAYER3WAVEFORMAT),ifstream::cur);
					snprintf( message, 512, "MPEGLAYER3WAVEFORMAT (\n  wFormatTag=0x%04x,\n  nChannels=%i,\n  nAvgBytesPerSec=%i,\n  nSamplesPerSec=%i,\n  wBitsPerSample=%i,\n  nBlockAlign=%i\n  fdwFlags%i,\n  nBlockSize%i,\n  nCodecDelay%i,\n  nFramesPerBlock%i,\n  wID=%i\n)",
							m_waveformat.wFormatTag, m_waveformat.nChannels, m_waveformat.nAvgBytesPerSec,
							m_waveformat.nSamplesPerSec, m_waveformat.wBitsPerSample, m_waveformat.nBlockAlign,
							m_waveformatMP3.fdwFlags, m_waveformatMP3.nBlockSize, m_waveformatMP3.nCodecDelay, m_waveformatMP3.nFramesPerBlock,
							m_waveformatMP3.wID);
				} else {
					_f.seekg(size-sizeof(avilib::WAVEFORMATEX),ifstream::cur);
					snprintf( message, 512, "WAVEFORMATEX (\n  wFormatTag=0x%04x,\n  nChannels=%i,\n  nAvgBytesPerSec=%i,\n  nSamplesPerSec=%i,\n  wBitsPerSample=%i,\n  nBlockAlign=%i\n)",
							m_waveformat.wFormatTag, m_waveformat.nChannels, m_waveformat.nAvgBytesPerSec,
							m_waveformat.nSamplesPerSec, m_waveformat.wBitsPerSample, m_waveformat.nBlockAlign );
				}
				log( message );
			} else {
				_f.read( (char *)&m_bitmapInfo, std::min( size, (uint32_t)sizeof(avilib::BITMAPINFO) ) );
				if( size>sizeof(avilib::BITMAPINFO) )
					_f.seekg(size-sizeof(avilib::BITMAPINFO),ifstream::cur);
				snprintf( message, 512, "BITMAPINFO (\n  biWidth=%i,\n  biHeight=%i,\n  biPlanes=%i,\n  biBitCount=%i,\n  biCompression=%s,\n  biSizeImage=%i,\n  biXPelsPerMeter=%i,\n  biYPelsPerMeter=%i,\n  biClrUsed=%i,\n  biClrImportant=%i,\n)",
						m_bitmapInfo.biWidth, m_bitmapInfo.biHeight, m_bitmapInfo.biPlanes,
						m_bitmapInfo.biBitCount, m_bitmapInfo.biCompression.fcc, m_bitmapInfo.biSizeImage,
						m_bitmapInfo.biXPelsPerMeter, m_bitmapInfo.biYPelsPerMeter,
						m_bitmapInfo.biClrUsed, m_bitmapInfo.biClrImportant);
				log( message );
			}
		}
		else if( *(uint32_t *)tag == (uint32_t)'OFNI' ){
			continue;
		}
		else if( *(uint32_t *)tag == (uint32_t)'TFSI' ){
			_f.read( (char *)&size, 4 );
			_f.seekg(size,ifstream::cur);
		}
		else if( *(uint32_t *)tag == (uint32_t)'nrts' ){
			_f.read( (char *)&size, 4 );
			_f.seekg(size-4,ifstream::cur);
		}
		else if( *(uint32_t *)tag == (uint32_t)'ivom' ){
			// the movie list, here is the data.
			m_moviOffs.push_back((size_t)_f.tellg() - 4);
			_f.seekg(size-4, ifstream::cur);
		}
		else if( *(uint32_t *)tag == (uint32_t)'1xdi' ){
			_f.read( (char *)&size, 4 );
			uint8_t *p = new uint8_t[size], *p0 = p;
			size = (uint32_t)_f.read((char *)p,size).gcount();
			for (size_t i=0; i<size/sizeof(AVIOLDINDEX); i++) {
				AVIOLDINDEX *idx = (AVIOLDINDEX *)p;
				p += sizeof(AVIOLDINDEX);
				
				if( idx->dwChunkId._ == ' cer' )
					continue;

				DMLINDEX dml_index;
				dml_index.dwChunkId = idx->dwChunkId;
				dml_index.u32_flags = idx->dwFlags;
				dml_index.i64_offset = idx->dwOffset;
				dml_index.u32_size = idx->dwSize;
				string fcc = idx->dwChunkId.fcc;
				int32_t stream_idx = atoi(fcc.substr(0,2).c_str());
				m_frameIdxs[stream_idx].push_back(dml_index);
/*
				switch(m_videoStreamIdx){
				case 0:
					if( idx->dwChunkId._ == (uint32_t)'cd00' || idx->dwChunkId._ == (uint32_t)'bd00' )//'bw10' )
						m_frameIdxs[stream_idx].push_back(dml_index);
					break;
				case 1:
					if( idx->dwChunkId._ == (uint32_t)'cd10' || idx->dwChunkId._ == (uint32_t)'bd10' )//'bw10' )
						m_frameIdxs[stream_idx].push_back(dml_index);
					break;
				}
 */
			}
			snprintf( message, 512, "%x AVIOLDINDEX", size/( uint32_t )sizeof(AVIOLDINDEX));
			log( message );
			delete [] p0;
		}
		else if( *(uint32_t *)tag == (uint32_t)'lmdo' ){
			continue;
		}
		else if( *(uint32_t *)tag == (uint32_t)'hlmd' ){
			_f.read( (char *)&size, 4 );
			_f.read((char *)&m_odmlExt, sizeof(avilib::ODMLExtendedAVIHeader));
			_f.seekg(size - sizeof(avilib::ODMLExtendedAVIHeader),ifstream::cur);
			snprintf( message, 512, "ODMLExtendedAVIHeader ( dwTotalFrames=%i )", m_odmlExt.dwTotalFrames); log( message );
		}
		else if( *(uint32_t *)tag == (uint32_t)'lhmd' ){
			_f.read( (char *)&size, 4 );
			_f.seekg(size,ifstream::cur);
		}
		else if( *(uint32_t *)tag == (uint32_t)'xdni' ){
			_f.read( (char *)&size, 4 );  // AVISUPERINDEX
			streampos superindex_end = _f.tellg() + (streampos)size;

			avilib::AVISUPERINDEX super_index;
			super_index.fcc._ = *((uint32_t *)&tag);
			super_index.cb = size;
			_f.read( (char *)&super_index + 8, sizeof(avilib::AVISUPERINDEX)-8 );

			string fcc = super_index.dwChunkId.fcc;
			int32_t stream_idx = atoi(fcc.substr(0,2).c_str());

			assert( 0 == super_index.bIndexSubType );
			if( 0 != super_index.bIndexSubType ) log( "Warning: 0 != super_index.bIndexSubType" );
			if( AVI_INDEX_OF_INDEXES != super_index.bIndexType ) log( "Warning: AVI_INDEX_OF_INDEXES != super_index.bIndexType" );
			deque<avilib::AVISUPERINDEX_ENTRY> entries;

			for( uint32_t i=0; i<super_index.nEntriesInUse; i++ )
			{
				avilib::AVISUPERINDEX_ENTRY entry;
				_f.read( (char *)&entry, sizeof(avilib::AVISUPERINDEX_ENTRY) );
				entries.push_back(entry);
			}

			snprintf( message, 512, "%ux AVISUPERINDEX_ENTRY (%s)", super_index.nEntriesInUse, fcc.c_str()); log( message );

			for( avilib::AVISUPERINDEX_ENTRY &entry : entries ){
				_f.seekg( entry.qwOffset, ifstream::beg );
				avilib::AVISTDINDEX std_index;
				memset( &std_index, 0x0, sizeof(avilib::AVISTDINDEX));
				_f.read( (char *)&std_index, sizeof(avilib::AVISTDINDEX) );

				if( std_index.dwChunkId._ == ' cer' )
					continue;

				std::array<uint32_t,6> allowed = {
					(uint32_t)'cd00', (uint32_t)'bd00', (uint32_t)'cd10', (uint32_t)'bd10',
					(uint32_t)'bw00', (uint32_t)'bw10' };

				if( std::find( allowed.begin(),allowed.end(), std_index.dwChunkId._ ) != allowed.end() ){

					// not for audio:
					if( AVI_INDEX_OF_CHUNKS != std_index.bIndexType ) log( "Warning: AVI_INDEX_OF_CHUNKS != std_index.bIndexType" );
					if( 0 != std_index.bIndexSubType ) log( "Warning: 0 != std_index.bIndexSubType" );

					//if( std_index.fcc._ == (uint32_t)'00xi' )
					{
						uint8_t *p = new uint8_t[std_index.cb], *p0 = p;
						_f.read( (char *)p, std_index.cb );
						for( uint32_t j=0; j<std_index.nEntriesInUse; j++ )
						{
							avilib::AVISTDINDEX_ENTRY *idx = (avilib::AVISTDINDEX_ENTRY *)p;
							p += sizeof(avilib::AVISTDINDEX_ENTRY);
						
							DMLINDEX dml_index;
							dml_index.dwChunkId = std_index.dwChunkId;
							dml_index.u32_flags = 0;
							dml_index.i64_offset = std_index.qwBaseOffset + idx->dwOffset;// + 4;
							dml_index.u32_size = idx->dwSize & 0x7FFFFFFF;
							if(dml_index.u32_size > m_bitmapInfo.biSizeImage){
								// int z=0;
							}

							odml_frameIdxs[stream_idx].push_back(dml_index);
						}
						delete [] p0;
					}
				}
				_f.clear();
			} // each superindex entry
			m_superIndex[stream_idx] = super_index;
			_f.clear();
			_f.seekg(superindex_end,ifstream::beg);
		}
		else if( *(uint32_t *)tag == (uint32_t)'prpv' ){
			// this does nothing and has never been tested.
			_f.read( (char *)&size, 4 );
			VIDEO_PROP_HEADER vprop_header;
			_f.read( (char *)&vprop_header, std::min((size_t)size,sizeof(VIDEO_PROP_HEADER)) );
			VIDEO_PROP_HEADER::VIDEO_FIELD_DESC *p_field_desc = (VIDEO_PROP_HEADER::VIDEO_FIELD_DESC *)malloc(sizeof(VIDEO_PROP_HEADER::VIDEO_FIELD_DESC)*vprop_header.nbFieldPerFrame);
			_f.read((char *)p_field_desc, vprop_header.nbFieldPerFrame*sizeof(VIDEO_PROP_HEADER::VIDEO_FIELD_DESC));
			free( p_field_desc );
		}
		else if( *(uint32_t *)tag == ( uint32_t )'tadT'/* Adobe Premiere Timecode */ ){
			continue;
		}
		else
		{
			_f.read( (char *)&size, 4 );
			_f.seekg(size,ifstream::cur);
			// FIXME: check size is smaller than current parent element's size
		}
	}

	if( !odml_frameIdxs.empty() ){
		m_frameIdxs.swap(odml_frameIdxs);
		log( "using OpenDML index" );
	}

	_f.clear();
	_f.seekg(0,ifstream::beg);

	if( m_moviOffs.empty() )
		return false;
	
	return true;
}